

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::Hashing::compute_hash_graphics_pipeline
               (StateRecorder *recorder,VkGraphicsPipelineCreateInfo *create_info,Hash *out_hash)

{
  int iVar1;
  VkPipelineDynamicStateCreateInfo *pVVar2;
  VkPipelineDepthStencilStateCreateInfo *pVVar3;
  VkPipelineInputAssemblyStateCreateInfo *pVVar4;
  VkPipelineRasterizationStateCreateInfo *pVVar5;
  VkPipelineMultisampleStateCreateInfo *pVVar6;
  VkPipelineViewportStateCreateInfo *pVVar7;
  VkRect2D *pVVar8;
  VkViewport *pVVar9;
  VkPipelineVertexInputStateCreateInfo *pVVar10;
  VkVertexInputAttributeDescription *pVVar11;
  VkVertexInputBindingDescription *pVVar12;
  VkPipelineColorBlendStateCreateInfo *pVVar13;
  VkPipelineColorBlendAttachmentState *pVVar14;
  VkPipelineTessellationStateCreateInfo *pVVar15;
  bool bVar16;
  int *piVar17;
  byte bVar18;
  uint uVar19;
  int *piVar20;
  undefined8 extraout_RDX;
  ulong uVar21;
  ulong uVar22;
  byte bVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  VkGraphicsPipelineLibraryFlagsEXT state_flags;
  uint uVar37;
  GlobalStateInfo GVar38;
  Hash hash;
  DynamicStateInfo dynamic_info;
  SubpassMeta meta;
  Hasher local_e0;
  undefined1 local_d7;
  byte local_d6;
  byte local_d5;
  VkGraphicsPipelineLibraryFlagsEXT local_d4;
  Hash local_d0;
  DynamicStateInfo local_c8;
  ulong local_88;
  uint local_7c;
  ulong local_78;
  DynamicStateInfo local_70;
  
  piVar17 = (int *)create_info->pNext;
  for (piVar20 = piVar17; piVar20 != (int *)0x0; piVar20 = *(int **)(piVar20 + 2)) {
    if (*piVar20 == 0x3b9fac02) goto LAB_0011134e;
  }
  piVar20 = (int *)0x0;
LAB_0011134e:
  uVar37 = create_info->flags;
  state_flags = 0xf;
  if (piVar20 != (int *)0x0 && (uVar37 >> 0xb & 1) != 0) {
    state_flags = piVar20[4];
  }
  for (; piVar17 != (int *)0x0; piVar17 = *(int **)(piVar17 + 2)) {
    if (*piVar17 == 0x3ba1f5f5) goto LAB_001113a3;
  }
  piVar17 = (int *)0x0;
LAB_001113a3:
  local_e0.h = (ulong)(uVar37 & 0x7ffffc3f) ^ 0xaf63bd4c8601b7df;
  if (piVar17 != (int *)0x0) {
    local_e0.h = 0xaf63bd4c8601b7df;
  }
  if (((uVar37 & 4) != 0) && (create_info->basePipelineHandle != (VkPipeline)0x0)) {
    bVar16 = StateRecorder::get_hash_for_graphics_pipeline_handle
                       (recorder,create_info->basePipelineHandle,&local_d0);
    if (!bVar16) {
      return false;
    }
    local_e0.h = ((local_d0 & 0xffffffff ^ local_e0.h * 0x100000001b3) * 0x100000001b3 ^
                 local_d0 >> 0x20) * 0x100000001b3 ^ (ulong)(uint)create_info->basePipelineIndex;
  }
  local_c8.color_blend_advanced = false;
  local_c8.provoking_vertex_mode = false;
  local_c8.line_rasterization_mode = false;
  local_c8.line_stipple_enable = false;
  local_c8.depth_clip_negative_one_to_one = false;
  local_c8.viewport_w_scaling_enable = false;
  local_c8.viewport_swizzle = false;
  local_c8.coverage_to_color_enable = false;
  local_c8.coverage_to_color_location = false;
  local_c8.coverage_modulation_mode = false;
  local_c8.coverage_modulation_table_enable = false;
  local_c8.coverage_modulation_table = false;
  local_c8.shading_rate_image_enable = false;
  local_c8.representative_fragment_test_enable = false;
  local_c8.coverage_reduction_mode = false;
  local_c8.depth_clamp_range = false;
  local_c8.tessellation_domain_origin = false;
  local_c8.depth_clamp_enable = false;
  local_c8.polygon_mode = false;
  local_c8.rasterization_samples = false;
  local_c8.sample_mask = false;
  local_c8.alpha_to_coverage_enable = false;
  local_c8.alpha_to_one_enable = false;
  local_c8.logic_op_enable = false;
  local_c8.color_blend_enable = false;
  local_c8.color_blend_equation = false;
  local_c8.color_write_mask = false;
  local_c8.rasterization_stream = false;
  local_c8.conservative_rasterization_mode = false;
  local_c8.extra_primitive_overestimation_size = false;
  local_c8.depth_clip_enable = false;
  local_c8.sample_locations_enable = false;
  local_c8.depth_bounds_test_enable = false;
  local_c8.stencil_test_enable = false;
  local_c8.stencil_op = false;
  local_c8.vertex_input = false;
  local_c8.vertex_input_binding_stride = false;
  local_c8.patch_control_points = false;
  local_c8.rasterizer_discard_enable = false;
  local_c8.primitive_restart_enable = false;
  local_c8.logic_op = false;
  local_c8.color_write_enable = false;
  local_c8.depth_bias_enable = false;
  local_c8.discard_rectangle = false;
  local_c8.discard_rectangle_mode = false;
  local_c8.fragment_shading_rate = false;
  local_c8.sample_locations = false;
  local_c8.line_stipple = false;
  local_c8.stencil_compare = false;
  local_c8.stencil_reference = false;
  local_c8.stencil_write_mask = false;
  local_c8.depth_bounds = false;
  local_c8.depth_bias = false;
  local_c8.line_width = false;
  local_c8.blend_constants = false;
  local_c8.scissor = false;
  local_c8.viewport = false;
  local_c8.scissor_count = false;
  local_c8.viewport_count = false;
  local_c8.cull_mode = false;
  local_c8.front_face = false;
  local_c8.depth_test_enable = false;
  local_c8.depth_write_enable = false;
  local_c8.depth_compare_op = false;
  if (create_info->pDynamicState != (VkPipelineDynamicStateCreateInfo *)0x0) {
    parse_dynamic_state_info(&local_70,create_info->pDynamicState);
    local_c8.stencil_write_mask = local_70.stencil_write_mask;
    local_c8.depth_bounds = local_70.depth_bounds;
    local_c8.depth_bias = local_70.depth_bias;
    local_c8.line_width = local_70.line_width;
    local_c8.blend_constants = local_70.blend_constants;
    local_c8.scissor = local_70.scissor;
    local_c8.stencil_compare = local_70.stencil_compare;
    local_c8.stencil_reference = local_70.stencil_reference;
    local_c8.color_blend_advanced = local_70.color_blend_advanced;
    local_c8.provoking_vertex_mode = local_70.provoking_vertex_mode;
    local_c8.line_rasterization_mode = local_70.line_rasterization_mode;
    local_c8.line_stipple_enable = local_70.line_stipple_enable;
    local_c8.depth_clip_negative_one_to_one = local_70.depth_clip_negative_one_to_one;
    local_c8.viewport_w_scaling_enable = local_70.viewport_w_scaling_enable;
    local_c8.viewport_swizzle = local_70.viewport_swizzle;
    local_c8.coverage_to_color_enable = local_70.coverage_to_color_enable;
    local_c8.coverage_to_color_location = local_70.coverage_to_color_location;
    local_c8.coverage_modulation_mode = local_70.coverage_modulation_mode;
    local_c8.coverage_modulation_table_enable = local_70.coverage_modulation_table_enable;
    local_c8.coverage_modulation_table = local_70.coverage_modulation_table;
    local_c8.shading_rate_image_enable = local_70.shading_rate_image_enable;
    local_c8.representative_fragment_test_enable = local_70.representative_fragment_test_enable;
    local_c8.coverage_reduction_mode = local_70.coverage_reduction_mode;
    local_c8.depth_clamp_range = local_70.depth_clamp_range;
    local_c8.tessellation_domain_origin = local_70.tessellation_domain_origin;
    local_c8.depth_clamp_enable = local_70.depth_clamp_enable;
    local_c8.polygon_mode = local_70.polygon_mode;
    local_c8.rasterization_samples = local_70.rasterization_samples;
    local_c8.sample_mask = local_70.sample_mask;
    local_c8.alpha_to_coverage_enable = local_70.alpha_to_coverage_enable;
    local_c8.alpha_to_one_enable = local_70.alpha_to_one_enable;
    local_c8.logic_op_enable = local_70.logic_op_enable;
    local_c8.color_blend_enable = local_70.color_blend_enable;
    local_c8.color_blend_equation = local_70.color_blend_equation;
    local_c8.color_write_mask = local_70.color_write_mask;
    local_c8.rasterization_stream = local_70.rasterization_stream;
    local_c8.conservative_rasterization_mode = local_70.conservative_rasterization_mode;
    local_c8.extra_primitive_overestimation_size = local_70.extra_primitive_overestimation_size;
    local_c8.depth_clip_enable = local_70.depth_clip_enable;
    local_c8.sample_locations_enable = local_70.sample_locations_enable;
    local_c8.depth_bounds_test_enable = local_70.depth_bounds_test_enable;
    local_c8.stencil_test_enable = local_70.stencil_test_enable;
    local_c8.stencil_op = local_70.stencil_op;
    local_c8.vertex_input = local_70.vertex_input;
    local_c8.vertex_input_binding_stride = local_70.vertex_input_binding_stride;
    local_c8.patch_control_points = local_70.patch_control_points;
    local_c8.rasterizer_discard_enable = local_70.rasterizer_discard_enable;
    local_c8.primitive_restart_enable = local_70.primitive_restart_enable;
    local_c8.logic_op = local_70.logic_op;
    local_c8.color_write_enable = local_70.color_write_enable;
    local_c8.depth_bias_enable = local_70.depth_bias_enable;
    local_c8.discard_rectangle = local_70.discard_rectangle;
    local_c8.discard_rectangle_mode = local_70.discard_rectangle_mode;
    local_c8.fragment_shading_rate = local_70.fragment_shading_rate;
    local_c8.sample_locations = local_70.sample_locations;
    local_c8.line_stipple = local_70.line_stipple;
    local_c8.viewport = local_70.viewport;
    local_c8.scissor_count = local_70.scissor_count;
    local_c8.viewport_count = local_70.viewport_count;
    local_c8.cull_mode = local_70.cull_mode;
    local_c8.front_face = local_70.front_face;
    local_c8.depth_test_enable = local_70.depth_test_enable;
    local_c8.depth_write_enable = local_70.depth_write_enable;
    local_c8.depth_compare_op = local_70.depth_compare_op;
  }
  local_70.stencil_compare = true;
  local_70.stencil_reference = true;
  GVar38 = parse_global_state_info(create_info,&local_c8,(SubpassMeta *)&local_70);
  if ((GVar38._8_3_ >> 8 & 1) == 0) {
    local_d0 = 0;
  }
  else {
    bVar16 = StateRecorder::get_hash_for_pipeline_layout(recorder,create_info->layout,&local_d0);
    if (!bVar16) {
      return false;
    }
  }
  local_e0.h = (local_d0 & 0xffffffff ^ local_e0.h * 0x100000001b3) * 0x100000001b3 ^
               local_d0 >> 0x20;
  local_d0 = 0;
  if ((((undefined1  [11])GVar38 & (undefined1  [11])0x1) == (undefined1  [11])0x0) ||
     (bVar16 = StateRecorder::get_hash_for_render_pass(recorder,create_info->renderPass,&local_d0),
     bVar16)) {
    uVar35 = (local_d0 & 0xffffffff ^ local_e0.h * 0x100000001b3) * 0x100000001b3 ^ local_d0 >> 0x20
    ;
    local_70.stencil_compare = false;
    local_70.stencil_reference = false;
    local_e0.h = uVar35;
    bVar16 = StateRecorder::Impl::get_subpass_meta_for_pipeline
                       (recorder->impl,create_info,local_d0,(SubpassMeta *)&local_70);
    if (bVar16) {
      GVar38 = parse_global_state_info(create_info,&local_c8,(SubpassMeta *)&local_70);
      uVar34 = GVar38._0_8_;
      uVar27 = (ulong)create_info->subpass;
      if (((undefined1  [11])GVar38 & (undefined1  [11])0x1) == (undefined1  [11])0x0) {
        uVar27 = 0;
      }
      local_7c = (uint)CONCAT53((int5)((ulong)extraout_RDX >> 0x18),GVar38._8_3_);
      uVar26 = (ulong)create_info->stageCount;
      if (((undefined1  [11])GVar38 & (undefined1  [11])0x10000) == (undefined1  [11])0x0) {
        uVar26 = 0;
      }
      uVar26 = uVar26 ^ (uVar27 ^ uVar35 * 0x100000001b3) * 0x100000001b3;
      pVVar2 = create_info->pDynamicState;
      local_88 = uVar34;
      if (pVVar2 == (VkPipelineDynamicStateCreateInfo *)0x0) {
        local_e0.h = uVar26 * 0x100000001b3;
      }
      else {
        uVar35 = (ulong)pVVar2->dynamicStateCount;
        local_e0.h = (uVar26 * 0x100000001b3 ^ uVar35) * 0x100000001b3 ^ (ulong)pVVar2->flags;
        if (uVar35 != 0) {
          uVar27 = 0;
          do {
            local_e0.h = local_e0.h * 0x100000001b3 ^ (ulong)pVVar2->pDynamicStates[uVar27];
            uVar27 = uVar27 + 1;
          } while (uVar35 != uVar27);
        }
        bVar16 = hash_pnext_chain(recorder,&local_e0,pVVar2->pNext,&local_c8,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      if ((uVar34 >> 0x20 & 1) == 0) {
        local_e0.h = local_e0.h * 0x100000001b3;
      }
      else {
        pVVar3 = create_info->pDepthStencilState;
        if (local_c8.depth_bounds_test_enable == false) {
          uVar35 = (ulong)pVVar3->depthBoundsTestEnable;
        }
        else {
          uVar35 = 0;
        }
        if (local_c8.depth_compare_op == false) {
          uVar27 = (ulong)pVVar3->depthCompareOp;
        }
        else {
          uVar27 = 0;
        }
        if (local_c8.depth_test_enable == false) {
          uVar26 = (ulong)pVVar3->depthTestEnable;
        }
        else {
          uVar26 = 0;
        }
        if (local_c8.depth_write_enable == false) {
          uVar21 = (ulong)pVVar3->depthWriteEnable;
        }
        else {
          uVar21 = 0;
        }
        if (local_c8.stencil_op == false) {
          uVar22 = (ulong)(pVVar3->front).compareOp;
        }
        else {
          uVar22 = 0;
        }
        if (local_c8.stencil_op == false) {
          uVar25 = (ulong)(pVVar3->front).depthFailOp;
        }
        else {
          uVar25 = 0;
        }
        if (local_c8.stencil_op == false) {
          uVar28 = (ulong)(pVVar3->front).failOp;
        }
        else {
          uVar28 = 0;
        }
        if (local_c8.stencil_op == false) {
          uVar29 = (ulong)(pVVar3->front).passOp;
        }
        else {
          uVar29 = 0;
        }
        if (local_c8.stencil_op == false) {
          uVar30 = (ulong)(pVVar3->back).compareOp;
        }
        else {
          uVar30 = 0;
        }
        if (local_c8.stencil_op == false) {
          uVar31 = (ulong)(pVVar3->back).depthFailOp;
        }
        else {
          uVar31 = 0;
        }
        if (local_c8.stencil_op == false) {
          uVar32 = (ulong)(pVVar3->back).failOp;
        }
        else {
          uVar32 = 0;
        }
        if (local_c8.stencil_op == false) {
          uVar24 = (ulong)(pVVar3->back).passOp;
        }
        else {
          uVar24 = 0;
        }
        if (local_c8.stencil_test_enable == false) {
          uVar33 = (ulong)pVVar3->stencilTestEnable;
        }
        else {
          uVar33 = 0;
        }
        local_e0.h = (((((((((((((local_e0.h * 0x100000001b3 ^ (ulong)pVVar3->flags) * 0x100000001b3
                                ^ uVar35) * 0x100000001b3 ^ uVar27) * 0x100000001b3 ^ uVar26) *
                              0x100000001b3 ^ uVar21) * 0x100000001b3 ^ uVar22) * 0x100000001b3 ^
                           uVar25) * 0x100000001b3 ^ uVar28) * 0x100000001b3 ^ uVar29) *
                         0x100000001b3 ^ uVar30) * 0x100000001b3 ^ uVar31) * 0x100000001b3 ^ uVar32)
                      * 0x100000001b3 ^ uVar24) * 0x100000001b3 ^ uVar33;
        if ((local_c8.depth_bounds == false) &&
           ((pVVar3->depthBoundsTestEnable == 0 & (local_c8.depth_bounds_test_enable ^ 1U)) == 0)) {
          local_e0.h = (local_e0.h * 0x100000001b3 ^ (ulong)(uint)pVVar3->minDepthBounds) *
                       0x100000001b3 ^ (ulong)(uint)pVVar3->maxDepthBounds;
        }
        if ((pVVar3->stencilTestEnable == 0 & (local_c8.stencil_test_enable ^ 1U)) == 0) {
          if (local_c8.stencil_compare == false) {
            local_e0.h = (local_e0.h * 0x100000001b3 ^ (ulong)(pVVar3->front).compareMask) *
                         0x100000001b3 ^ (ulong)(pVVar3->back).compareMask;
          }
          if (local_c8.stencil_reference == false) {
            local_e0.h = (local_e0.h * 0x100000001b3 ^ (ulong)(pVVar3->front).reference) *
                         0x100000001b3 ^ (ulong)(pVVar3->back).reference;
          }
          if (local_c8.stencil_write_mask == false) {
            local_e0.h = (local_e0.h * 0x100000001b3 ^ (ulong)(pVVar3->front).writeMask) *
                         0x100000001b3 ^ (ulong)(pVVar3->back).writeMask;
          }
        }
        bVar16 = hash_pnext_chain(recorder,&local_e0,pVVar3->pNext,&local_c8,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      if (((undefined1  [11])GVar38 & (undefined1  [11])0x1) == (undefined1  [11])0x0) {
        local_e0.h = local_e0.h * 0x100000001b3;
      }
      else {
        pVVar4 = create_info->pInputAssemblyState;
        if (local_c8.primitive_restart_enable == false) {
          uVar35 = (ulong)pVVar4->primitiveRestartEnable;
        }
        else {
          uVar35 = 0;
        }
        local_e0.h = ((local_e0.h * 0x100000001b3 ^ (ulong)pVVar4->flags) * 0x100000001b3 ^ uVar35)
                     * 0x100000001b3 ^ (ulong)pVVar4->topology;
        bVar16 = hash_pnext_chain(recorder,&local_e0,pVVar4->pNext,&local_c8,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      if ((uVar34 >> 0x38 & 1) == 0) {
        local_e0.h = local_e0.h * 0x100000001b3;
      }
      else {
        pVVar5 = create_info->pRasterizationState;
        if (local_c8.cull_mode == false) {
          uVar35 = (ulong)pVVar5->cullMode;
        }
        else {
          uVar35 = 0;
        }
        if (local_c8.depth_clamp_enable == false) {
          uVar27 = (ulong)pVVar5->depthClampEnable;
        }
        else {
          uVar27 = 0;
        }
        if (local_c8.front_face == false) {
          uVar26 = (ulong)pVVar5->frontFace;
        }
        else {
          uVar26 = 0;
        }
        if (local_c8.rasterizer_discard_enable == false) {
          uVar21 = (ulong)pVVar5->rasterizerDiscardEnable;
        }
        else {
          uVar21 = 0;
        }
        if (local_c8.polygon_mode == false) {
          uVar22 = (ulong)pVVar5->polygonMode;
        }
        else {
          uVar22 = 0;
        }
        if (local_c8.depth_bias_enable == false) {
          uVar25 = (ulong)pVVar5->depthBiasEnable;
        }
        else {
          uVar25 = 0;
        }
        local_e0.h = ((((((local_e0.h * 0x100000001b3 ^ (ulong)pVVar5->flags) * 0x100000001b3 ^
                         uVar35) * 0x100000001b3 ^ uVar27) * 0x100000001b3 ^ uVar26) * 0x100000001b3
                      ^ uVar21) * 0x100000001b3 ^ uVar22) * 0x100000001b3 ^ uVar25;
        if (((pVVar5->depthBiasEnable == 0 & (local_c8.depth_bias_enable ^ 1U)) == 0) &&
           (local_c8.depth_bias == false)) {
          local_e0.h = ((local_e0.h * 0x100000001b3 ^ (ulong)(uint)pVVar5->depthBiasClamp) *
                        0x100000001b3 ^ (ulong)(uint)pVVar5->depthBiasSlopeFactor) * 0x100000001b3 ^
                       (ulong)(uint)pVVar5->depthBiasConstantFactor;
        }
        if (local_c8.line_width == false) {
          local_e0.h = local_e0.h * 0x100000001b3 ^ (ulong)(uint)pVVar5->lineWidth;
        }
        bVar16 = hash_pnext_chain(recorder,&local_e0,pVVar5->pNext,&local_c8,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      if ((GVar38._0_4_ >> 0x18 & 1) != 0) {
        pVVar6 = create_info->pMultisampleState;
        if (local_c8.alpha_to_coverage_enable == false) {
          uVar35 = (ulong)pVVar6->alphaToCoverageEnable;
        }
        else {
          uVar35 = 0;
        }
        if (local_c8.alpha_to_one_enable == false) {
          uVar27 = (ulong)pVVar6->alphaToOneEnable;
        }
        else {
          uVar27 = 0;
        }
        if (local_c8.rasterization_samples == false) {
          uVar26 = (ulong)pVVar6->rasterizationSamples;
        }
        else {
          uVar26 = 0;
        }
        local_e0.h = (((((local_e0.h * 0x100000001b3 ^ (ulong)pVVar6->flags) * 0x100000001b3 ^
                        uVar35) * 0x100000001b3 ^ uVar27) * 0x100000001b3 ^
                      (ulong)(uint)pVVar6->minSampleShading) * 0x100000001b3 ^ uVar26) *
                     0x100000001b3 ^ (ulong)pVVar6->sampleShadingEnable;
        if ((local_c8.sample_mask == false) && (pVVar6->pSampleMask != (VkSampleMask *)0x0)) {
          uVar37 = pVVar6->rasterizationSamples +
                   (VK_SAMPLE_COUNT_32_BIT|VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_8_BIT|
                    VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_2_BIT);
          if (0x3e < uVar37) {
            uVar19 = pVVar6->rasterizationSamples +
                     (VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_4_BIT|
                      VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT);
            if ((int)uVar19 < 0) {
              uVar19 = uVar37;
            }
            uVar35 = 0;
            do {
              local_e0.h = local_e0.h * 0x100000001b3 ^ (ulong)pVVar6->pSampleMask[uVar35];
              uVar35 = uVar35 + 1;
            } while (((int)uVar19 >> 5) + (uint)((int)uVar19 >> 5 == 0) != uVar35);
          }
        }
        else {
          local_e0.h = local_e0.h * 0x100000001b3;
        }
        bVar16 = hash_pnext_chain(recorder,&local_e0,pVVar6->pNext,&local_c8,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      if ((GVar38._0_4_ >> 0x10 & 1) == 0) {
        local_e0.h = local_e0.h * 0x100000001b3;
      }
      else {
        pVVar7 = create_info->pViewportState;
        if (local_c8.scissor_count == false) {
          uVar35 = (ulong)pVVar7->scissorCount;
        }
        else {
          uVar35 = 0;
        }
        if (local_c8.viewport_count == false) {
          uVar27 = (ulong)pVVar7->viewportCount;
        }
        else {
          uVar27 = 0;
        }
        local_e0.h = ((local_e0.h * 0x100000001b3 ^ (ulong)pVVar7->flags) * 0x100000001b3 ^ uVar35)
                     * 0x100000001b3 ^ uVar27;
        if ((local_c8.scissor == false) && ((ulong)pVVar7->scissorCount != 0)) {
          pVVar8 = pVVar7->pScissors;
          lVar36 = 0;
          do {
            local_e0.h = (((local_e0.h * 0x100000001b3 ^
                           (ulong)*(uint *)((long)&(pVVar8->offset).x + lVar36)) * 0x100000001b3 ^
                          (ulong)*(uint *)((long)&(pVVar8->offset).y + lVar36)) * 0x100000001b3 ^
                         (ulong)*(uint *)((long)&(pVVar8->extent).width + lVar36)) * 0x100000001b3 ^
                         (ulong)*(uint *)((long)&(pVVar8->extent).height + lVar36);
            lVar36 = lVar36 + 0x10;
          } while ((ulong)pVVar7->scissorCount << 4 != lVar36);
        }
        if ((local_c8.viewport == false) && ((ulong)pVVar7->viewportCount != 0)) {
          pVVar9 = pVVar7->pViewports;
          lVar36 = 0;
          do {
            local_e0.h = (((((local_e0.h * 0x100000001b3 ^
                             (ulong)*(uint *)((long)&pVVar9->x + lVar36)) * 0x100000001b3 ^
                            (ulong)*(uint *)((long)&pVVar9->y + lVar36)) * 0x100000001b3 ^
                           (ulong)*(uint *)((long)&pVVar9->width + lVar36)) * 0x100000001b3 ^
                          (ulong)*(uint *)((long)&pVVar9->height + lVar36)) * 0x100000001b3 ^
                         (ulong)*(uint *)((long)&pVVar9->minDepth + lVar36)) * 0x100000001b3 ^
                         (ulong)*(uint *)((long)&pVVar9->maxDepth + lVar36);
            lVar36 = lVar36 + 0x18;
          } while ((ulong)pVVar7->viewportCount * 0x18 != lVar36);
        }
        bVar16 = hash_pnext_chain(recorder,&local_e0,pVVar7->pNext,&local_c8,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      if ((uVar34 >> 0x30 & 1) == 0) {
        local_e0.h = local_e0.h * 0x100000001b3;
      }
      else {
        pVVar10 = create_info->pVertexInputState;
        uVar27 = (ulong)pVVar10->vertexAttributeDescriptionCount;
        uVar35 = (ulong)pVVar10->vertexBindingDescriptionCount;
        local_e0.h = ((local_e0.h * 0x100000001b3 ^ (ulong)pVVar10->flags) * 0x100000001b3 ^ uVar27)
                     * 0x100000001b3 ^ uVar35;
        if (uVar27 != 0) {
          pVVar11 = pVVar10->pVertexAttributeDescriptions;
          lVar36 = 0;
          do {
            local_e0.h = (((local_e0.h * 0x100000001b3 ^
                           (ulong)*(uint *)((long)&pVVar11->offset + lVar36)) * 0x100000001b3 ^
                          (ulong)*(uint *)((long)&pVVar11->binding + lVar36)) * 0x100000001b3 ^
                         (ulong)*(uint *)((long)&pVVar11->format + lVar36)) * 0x100000001b3 ^
                         (ulong)*(uint *)((long)&pVVar11->location + lVar36);
            lVar36 = lVar36 + 0x10;
          } while (uVar27 << 4 != lVar36);
        }
        if (uVar35 != 0) {
          pVVar12 = pVVar10->pVertexBindingDescriptions;
          lVar36 = 0;
          do {
            if (local_c8.vertex_input_binding_stride == false) {
              uVar27 = (ulong)*(uint *)((long)&pVVar12->stride + lVar36);
            }
            else {
              uVar27 = 0;
            }
            local_e0.h = ((local_e0.h * 0x100000001b3 ^
                          (ulong)*(uint *)((long)&pVVar12->binding + lVar36)) * 0x100000001b3 ^
                         (ulong)*(uint *)((long)&pVVar12->inputRate + lVar36)) * 0x100000001b3 ^
                         uVar27;
            lVar36 = lVar36 + 0xc;
          } while (uVar35 * 0xc != lVar36);
        }
        bVar16 = hash_pnext_chain(recorder,&local_e0,pVVar10->pNext,&local_c8,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      local_d4 = state_flags;
      if (((undefined1  [11])GVar38 & (undefined1  [11])0x10000000000) == (undefined1  [11])0x0) {
        local_e0.h = local_e0.h * 0x100000001b3;
      }
      else {
        pVVar13 = create_info->pColorBlendState;
        local_78 = (ulong)pVVar13->attachmentCount;
        if (local_c8.logic_op_enable == false) {
          uVar35 = (ulong)pVVar13->logicOpEnable;
        }
        else {
          uVar35 = 0;
        }
        if ((local_c8.logic_op == false) &&
           ((pVVar13->logicOpEnable == 0 & (local_c8.logic_op_enable ^ 1U)) == 0)) {
          uVar27 = (ulong)pVVar13->logicOp;
        }
        else {
          uVar27 = 0;
        }
        local_e0.h = (((local_e0.h * 0x100000001b3 ^ (ulong)pVVar13->flags) * 0x100000001b3 ^
                      local_78) * 0x100000001b3 ^ uVar35) * 0x100000001b3 ^ uVar27;
        if ((local_c8.color_blend_enable != true) ||
           (bVar23 = local_c8.color_blend_equation, local_c8.color_write_mask != true)) {
          bVar23 = 0;
        }
        if (bVar23 != 0) {
          local_e0.h = local_e0.h * 0x100000001b3;
        }
        bVar18 = local_c8.color_blend_equation;
        if (pVVar13->attachmentCount != 0 && bVar23 == 0) {
          local_d7 = local_c8.color_blend_advanced;
          pVVar14 = pVVar13->pAttachments;
          uVar35 = 1;
          lVar36 = 0;
          local_d5 = local_c8.color_blend_equation;
          local_d6 = local_c8.color_blend_equation;
          do {
            if (local_c8.color_blend_enable == false) {
              uVar27 = (ulong)*(uint *)((long)&pVVar13->pAttachments->blendEnable + lVar36);
            }
            else {
              uVar27 = 0;
            }
            if (local_c8.color_write_mask == false) {
              uVar34 = (ulong)*(uint *)((long)&pVVar13->pAttachments->colorWriteMask + lVar36);
            }
            else {
              uVar34 = 0;
            }
            uVar34 = (local_e0.h * 0x100000001b3 ^ uVar27) * 0x100000001b3 ^ uVar34;
            if ((*(int *)((long)&pVVar14->blendEnable + lVar36) == 0 &
                (local_c8.color_blend_enable ^ 1U)) == 0) {
              if (local_c8.color_blend_equation == false) {
                if ((local_c8._48_8_ & 1) == 0) {
                  uVar37 = *(uint *)((long)&pVVar14->alphaBlendOp + lVar36);
                }
                else {
                  uVar37 = 0;
                }
                if ((local_c8._48_8_ & 1) == 0) {
                  uVar27 = (ulong)*(uint *)((long)&pVVar14->colorBlendOp + lVar36);
                }
                else {
                  uVar27 = 0;
                }
                local_e0.h = ((((((ulong)uVar37 ^ uVar34 * 0x100000001b3) * 0x100000001b3 ^ uVar27)
                                * 0x100000001b3 ^
                               (ulong)*(uint *)((long)&pVVar14->dstAlphaBlendFactor + lVar36)) *
                               0x100000001b3 ^
                              (ulong)*(uint *)((long)&pVVar14->srcAlphaBlendFactor + lVar36)) *
                              0x100000001b3 ^
                             (ulong)*(uint *)((long)&pVVar14->dstColorBlendFactor + lVar36)) *
                             0x100000001b3 ^
                             (ulong)*(uint *)((long)&pVVar14->srcColorBlendFactor + lVar36);
              }
              else {
                local_e0.h = uVar34 * 0x100000001b3;
              }
              iVar1 = *(int *)((long)&pVVar14->dstAlphaBlendFactor + lVar36);
              if (((((iVar1 == 10) || (iVar1 == 0xc)) ||
                   (iVar1 = *(int *)((long)&pVVar14->srcAlphaBlendFactor + lVar36), iVar1 == 10)) ||
                  ((iVar1 == 0xc ||
                   (iVar1 = *(int *)((long)&pVVar14->dstColorBlendFactor + lVar36), iVar1 == 10))))
                 || ((iVar1 == 0xc ||
                     ((iVar1 = *(int *)((long)&pVVar14->srcColorBlendFactor + lVar36), iVar1 == 0xc
                      || (iVar1 == 10)))))) {
                local_d6 = 1;
              }
            }
            else {
              local_e0.h = uVar34 * 0x100000001b3;
            }
            bVar16 = uVar35 < local_78;
            lVar36 = lVar36 + 0x20;
            uVar35 = uVar35 + 1;
            uVar34 = local_88;
            bVar18 = local_d6;
          } while (bVar16 && bVar23 == 0);
        }
        if (((bVar18 & 1) != 0) && (local_c8.blend_constants == false)) {
          lVar36 = 0;
          do {
            local_e0.h = local_e0.h * 0x100000001b3 ^
                         (ulong)*(uint *)((long)pVVar13->blendConstants + lVar36);
            lVar36 = lVar36 + 4;
          } while (lVar36 != 0x10);
        }
        bVar16 = hash_pnext_chain(recorder,&local_e0,pVVar13->pNext,&local_c8,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      if (((uint)uVar34 >> 8 & 1) == 0) {
        local_e0.h = local_e0.h * 0x100000001b3;
      }
      else {
        pVVar15 = create_info->pTessellationState;
        if (local_c8.patch_control_points == false) {
          uVar35 = (ulong)pVVar15->patchControlPoints;
        }
        else {
          uVar35 = 0;
        }
        local_e0.h = (local_e0.h * 0x100000001b3 ^ (ulong)pVVar15->flags) * 0x100000001b3 ^ uVar35;
        bVar16 = hash_pnext_chain(recorder,&local_e0,pVVar15->pNext,&local_c8,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      if (((local_7c >> 0x10 & 1) != 0) && (create_info->stageCount != 0)) {
        lVar36 = 0;
        uVar35 = 0;
        do {
          bVar16 = compute_hash_stage(recorder,&local_e0,
                                      (VkPipelineShaderStageCreateInfo *)
                                      ((long)&create_info->pStages->sType + lVar36));
          if (!bVar16) {
            return false;
          }
          uVar35 = uVar35 + 1;
          lVar36 = lVar36 + 0x30;
        } while (uVar35 < create_info->stageCount);
      }
      bVar16 = hash_pnext_chain(recorder,&local_e0,create_info->pNext,&local_c8,local_d4);
      if (bVar16) {
        *out_hash = local_e0.h;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool compute_hash_graphics_pipeline(const StateRecorder &recorder, const VkGraphicsPipelineCreateInfo &create_info, Hash *out_hash)
{
	// Ignore pipelines that cannot result in meaningful replay.
	auto state_flags = graphics_pipeline_get_effective_state_flags(create_info);

	Hasher h;
	Hash hash;

	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, create_info.pNext))
		h.u32(0);
	else
		h.u32(normalize_pipeline_creation_flags(create_info.flags));

	if ((create_info.flags & VK_PIPELINE_CREATE_DERIVATIVE_BIT) != 0 &&
	    create_info.basePipelineHandle != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_graphics_pipeline_handle(create_info.basePipelineHandle, &hash))
			return false;
		h.u64(hash);
		h.s32(create_info.basePipelineIndex);
	}

	DynamicStateInfo dynamic_info = {};
	if (create_info.pDynamicState)
		dynamic_info = parse_dynamic_state_info(*create_info.pDynamicState);
	GlobalStateInfo global_info = parse_global_state_info(create_info, dynamic_info, { true, true });

	if (global_info.layout_state)
	{
		if (!recorder.get_hash_for_pipeline_layout(create_info.layout, &hash))
			return false;
	}
	else
		hash = 0;

	h.u64(hash);

	// Need to query state info in two stages. Do we ignore render pass? If so, query a 0 hash.
	// If we don't ignore render pass, we can query for subpass meta.
	hash = 0;
	if (global_info.render_pass_state && !recorder.get_hash_for_render_pass(create_info.renderPass, &hash))
		return false;
	h.u64(hash);

	StateRecorder::SubpassMeta meta = {};
	if (!recorder.get_subpass_meta_for_pipeline(create_info, hash, &meta))
		return false;

	global_info = parse_global_state_info(create_info, dynamic_info, meta);

	h.u32(global_info.render_pass_state ? create_info.subpass : 0u);
	h.u32(global_info.module_state ? create_info.stageCount : 0u);

	if (create_info.pDynamicState)
	{
		auto &state = *create_info.pDynamicState;
		h.u32(state.dynamicStateCount);
		h.u32(state.flags);
		for (uint32_t i = 0; i < state.dynamicStateCount; i++)
			h.u32(state.pDynamicStates[i]);
		if (!hash_pnext_chain(&recorder, h, state.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.depth_stencil_state)
	{
		auto &ds = *create_info.pDepthStencilState;
		h.u32(ds.flags);
		h.u32(dynamic_info.depth_bounds_test_enable ? 0 : ds.depthBoundsTestEnable);
		h.u32(dynamic_info.depth_compare_op ? 0 : ds.depthCompareOp);
		h.u32(dynamic_info.depth_test_enable ? 0 : ds.depthTestEnable);
		h.u32(dynamic_info.depth_write_enable ? 0 : ds.depthWriteEnable);
		h.u32(dynamic_info.stencil_op ? 0 : ds.front.compareOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.front.depthFailOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.front.failOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.front.passOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.back.compareOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.back.depthFailOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.back.failOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.back.passOp);
		h.u32(dynamic_info.stencil_test_enable ? 0 : ds.stencilTestEnable);

		if (!dynamic_info.depth_bounds && (ds.depthBoundsTestEnable || dynamic_info.depth_bounds_test_enable))
		{
			h.f32(ds.minDepthBounds);
			h.f32(ds.maxDepthBounds);
		}

		if (ds.stencilTestEnable || dynamic_info.stencil_test_enable)
		{
			if (!dynamic_info.stencil_compare)
			{
				h.u32(ds.front.compareMask);
				h.u32(ds.back.compareMask);
			}

			if (!dynamic_info.stencil_reference)
			{
				h.u32(ds.front.reference);
				h.u32(ds.back.reference);
			}

			if (!dynamic_info.stencil_write_mask)
			{
				h.u32(ds.front.writeMask);
				h.u32(ds.back.writeMask);
			}
		}

		if (!hash_pnext_chain(&recorder, h, ds.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.input_assembly)
	{
		auto &ia = *create_info.pInputAssemblyState;
		h.u32(ia.flags);
		h.u32(dynamic_info.primitive_restart_enable ? 0 : ia.primitiveRestartEnable);
		// Dynamic 3 makes this fully ignored, but it depends on a property. For sanity's sake we need to hash this.
		h.u32(ia.topology);

		if (!hash_pnext_chain(&recorder, h, ia.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.rasterization_state)
	{
		auto &rs = *create_info.pRasterizationState;
		h.u32(rs.flags);
		h.u32(dynamic_info.cull_mode ? 0 : rs.cullMode);
		h.u32(dynamic_info.depth_clamp_enable ? 0 : rs.depthClampEnable);
		h.u32(dynamic_info.front_face ? 0 : rs.frontFace);
		h.u32(dynamic_info.rasterizer_discard_enable ? 0 : rs.rasterizerDiscardEnable);
		h.u32(dynamic_info.polygon_mode ? 0 : rs.polygonMode);
		h.u32(dynamic_info.depth_bias_enable ? 0 : rs.depthBiasEnable);

		if ((rs.depthBiasEnable || dynamic_info.depth_bias_enable) && !dynamic_info.depth_bias)
		{
			h.f32(rs.depthBiasClamp);
			h.f32(rs.depthBiasSlopeFactor);
			h.f32(rs.depthBiasConstantFactor);
		}

		if (!dynamic_info.line_width)
			h.f32(rs.lineWidth);

		if (!hash_pnext_chain(&recorder, h, rs.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.multisample_state)
	{
		auto &ms = *create_info.pMultisampleState;
		h.u32(ms.flags);
		h.u32(dynamic_info.alpha_to_coverage_enable ? 0 : ms.alphaToCoverageEnable);
		h.u32(dynamic_info.alpha_to_one_enable ? 0 : ms.alphaToOneEnable);
		h.f32(ms.minSampleShading);
		h.u32(dynamic_info.rasterization_samples ? 0 : ms.rasterizationSamples);
		h.u32(ms.sampleShadingEnable);
		if (!dynamic_info.sample_mask && ms.pSampleMask)
		{
			uint32_t elems = (ms.rasterizationSamples + 31) / 32;
			for (uint32_t i = 0; i < elems; i++)
				h.u32(ms.pSampleMask[i]);
		}
		else
			h.u32(0);

		if (!hash_pnext_chain(&recorder, h, ms.pNext, &dynamic_info, state_flags))
			return false;
	}

	if (global_info.viewport_state)
	{
		auto &vp = *create_info.pViewportState;
		h.u32(vp.flags);
		h.u32(dynamic_info.scissor_count ? 0 : vp.scissorCount);
		h.u32(dynamic_info.viewport_count ? 0 : vp.viewportCount);

		if (!dynamic_info.scissor)
		{
			for (uint32_t i = 0; i < vp.scissorCount; i++)
			{
				h.s32(vp.pScissors[i].offset.x);
				h.s32(vp.pScissors[i].offset.y);
				h.u32(vp.pScissors[i].extent.width);
				h.u32(vp.pScissors[i].extent.height);
			}
		}

		if (!dynamic_info.viewport)
		{
			for (uint32_t i = 0; i < vp.viewportCount; i++)
			{
				h.f32(vp.pViewports[i].x);
				h.f32(vp.pViewports[i].y);
				h.f32(vp.pViewports[i].width);
				h.f32(vp.pViewports[i].height);
				h.f32(vp.pViewports[i].minDepth);
				h.f32(vp.pViewports[i].maxDepth);
			}
		}

		if (!hash_pnext_chain(&recorder, h, vp.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.vertex_input)
	{
		auto &vi = *create_info.pVertexInputState;
		h.u32(vi.flags);
		h.u32(vi.vertexAttributeDescriptionCount);
		h.u32(vi.vertexBindingDescriptionCount);

		for (uint32_t i = 0; i < vi.vertexAttributeDescriptionCount; i++)
		{
			h.u32(vi.pVertexAttributeDescriptions[i].offset);
			h.u32(vi.pVertexAttributeDescriptions[i].binding);
			h.u32(vi.pVertexAttributeDescriptions[i].format);
			h.u32(vi.pVertexAttributeDescriptions[i].location);
		}

		for (uint32_t i = 0; i < vi.vertexBindingDescriptionCount; i++)
		{
			h.u32(vi.pVertexBindingDescriptions[i].binding);
			h.u32(vi.pVertexBindingDescriptions[i].inputRate);
			h.u32(dynamic_info.vertex_input_binding_stride ? 0 : vi.pVertexBindingDescriptions[i].stride);
		}

		if (!hash_pnext_chain(&recorder, h, vi.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.color_blend_state)
	{
		auto &b = *create_info.pColorBlendState;
		h.u32(b.flags);
		h.u32(b.attachmentCount);
		h.u32(dynamic_info.logic_op_enable ? 0 : b.logicOpEnable);
		h.u32(dynamic_info.logic_op || (!b.logicOpEnable && !dynamic_info.logic_op_enable) ? 0 : b.logicOp);

		bool need_blend_constants = false;

		// Special EDS3 rule. If all of these are set, we must ignore the pAttachments pointer.
		const bool dynamic_attachments = dynamic_info.color_blend_enable &&
		                                 dynamic_info.color_write_mask &&
		                                 dynamic_info.color_blend_equation;

		// If we have dynamic equation, but not dynamic blend constants, we can dynamically set blend constant
		// as input, so we might need to know those constants to hash the PSO.
		if (dynamic_info.color_blend_equation)
			need_blend_constants = true;

		if (dynamic_attachments)
			h.u32(0);

		for (uint32_t i = 0; !dynamic_attachments && i < b.attachmentCount; i++)
		{
			h.u32(dynamic_info.color_blend_enable ? 0 : b.pAttachments[i].blendEnable);
			h.u32(dynamic_info.color_write_mask ? 0 : b.pAttachments[i].colorWriteMask);
			if (b.pAttachments[i].blendEnable || dynamic_info.color_blend_enable)
			{
				if (!dynamic_info.color_blend_equation)
				{
					h.u32(dynamic_info.color_blend_advanced ? 0 : b.pAttachments[i].alphaBlendOp);
					h.u32(dynamic_info.color_blend_advanced ? 0 : b.pAttachments[i].colorBlendOp);
					h.u32(b.pAttachments[i].dstAlphaBlendFactor);
					h.u32(b.pAttachments[i].srcAlphaBlendFactor);
					h.u32(b.pAttachments[i].dstColorBlendFactor);
					h.u32(b.pAttachments[i].srcColorBlendFactor);
				}
				else
					h.u32(0);

				if (b.pAttachments[i].dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				    b.pAttachments[i].dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				    b.pAttachments[i].srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				    b.pAttachments[i].srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				    b.pAttachments[i].dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				    b.pAttachments[i].dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				    b.pAttachments[i].srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				    b.pAttachments[i].srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR)
				{
					need_blend_constants = true;
				}
			}
			else
				h.u32(0);
		}

		if (need_blend_constants && !dynamic_info.blend_constants)
			for (auto &blend_const : b.blendConstants)
				h.f32(blend_const);

		if (!hash_pnext_chain(&recorder, h, b.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.tessellation_state)
	{
		auto &tess = *create_info.pTessellationState;
		h.u32(tess.flags);
		h.u32(dynamic_info.patch_control_points ? 0 : tess.patchControlPoints);

		if (!hash_pnext_chain(&recorder, h, tess.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.module_state)
	{
		for (uint32_t i = 0; i < create_info.stageCount; i++)
		{
			auto &stage = create_info.pStages[i];
			if (!compute_hash_stage(recorder, h, stage))
				return false;
		}
	}

	if (!hash_pnext_chain(&recorder, h, create_info.pNext, &dynamic_info, state_flags))
		return false;

	*out_hash = h.get();
	return true;
}